

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preview.c
# Opt level: O0

exr_result_t exr_attr_preview_destroy(exr_context_t ctxt,exr_attr_preview_t *p)

{
  undefined8 *in_RSI;
  long in_RDI;
  exr_attr_preview_t nil;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  long local_10;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (undefined8 *)0x0) {
      local_18 = in_RSI;
      local_10 = in_RDI;
      memset(&local_30,0,0x18);
      if ((local_18[2] != 0) && (local_18[1] != 0)) {
        (**(code **)(local_10 + 0x60))(local_18[2]);
      }
      *local_18 = local_30;
      local_18[1] = local_28;
      local_18[2] = local_20;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_preview_destroy (exr_context_t ctxt, exr_attr_preview_t* p)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (p)
    {
        exr_attr_preview_t nil = {0};
        if (p->rgba && p->alloc_size > 0)
            ctxt->free_fn (EXR_CONST_CAST (uint8_t*, p->rgba));
        *p = nil;
    }
    return EXR_ERR_SUCCESS;
}